

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.hpp
# Opt level: O2

SPIRConstantOp * __thiscall
spirv_cross::Parser::
set<spirv_cross::SPIRConstantOp,unsigned_int&,spv::Op&,unsigned_int_const*,unsigned_int>
          (Parser *this,uint32_t id,uint *args,Op *args_1,uint **args_2,uint *args_3)

{
  SPIRConstantOp *pSVar1;
  
  ParsedIR::add_typed_id(&this->ir,TypeConstantOp,(ID)id);
  pSVar1 = variant_set<spirv_cross::SPIRConstantOp,unsigned_int&,spv::Op&,unsigned_int_const*,unsigned_int>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id,args,args_1,
                      args_2,args_3);
  (pSVar1->super_IVariant).self.id = id;
  return pSVar1;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		return var;
	}